

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_msubs64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                  TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i64 dest;
  TCGv_i32 arg5;
  TCGv_i32 temp;
  TCGv_i64 r1;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_high_local;
  TCGv_i32 arg1_low_local;
  TCGv_i32 rh_local;
  TCGv_i32 rl_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  dest = tcg_temp_new_i64(tcg_ctx_00);
  arg5 = tcg_const_i32_tricore(tcg_ctx_00,n);
  tcg_gen_concat_i32_i64_tricore(tcg_ctx_00,dest,arg1_low,arg1_high);
  gen_helper_msub64_q_ssov(tcg_ctx_00,dest,tcg_ctx_00->cpu_env,dest,arg2,arg3,arg5);
  tcg_gen_extr_i64_i32_tricore(tcg_ctx_00,rl,rh,dest);
  tcg_temp_free_i64(tcg_ctx_00,dest);
  tcg_temp_free_i32(tcg_ctx_00,arg5);
  return;
}

Assistant:

static inline void
gen_msubs64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
             TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv_i64 r1 = tcg_temp_new_i64(tcg_ctx);
    TCGv temp = tcg_const_i32(tcg_ctx, n);

    tcg_gen_concat_i32_i64(tcg_ctx, r1, arg1_low, arg1_high);
    gen_helper_msub64_q_ssov(tcg_ctx, r1, tcg_ctx->cpu_env, r1, arg2, arg3, temp);
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, r1);

    tcg_temp_free_i64(tcg_ctx, r1);
    tcg_temp_free(tcg_ctx, temp);
}